

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_p_h_m_weighted_by_squared_diag_distance.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  char **__args;
  double dVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  Persistence_heat_maps l;
  stringstream ss;
  char **local_2e8;
  iterator iStack_2e0;
  char **local_2d8;
  uint local_2c4;
  ios_base *local_2c0;
  double local_2b8;
  double local_2b0;
  size_t local_2a8;
  long *local_2a0;
  long local_290 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_280;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_268;
  Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
  local_250;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base aiStack_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program creates persistence heat map files (*.mps) of persistence diagrams files (*.pers) "
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "provided as an input.The Gaussian kernels are weighted by the square of distance of a center from the "
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"diagonal.\n",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The first parameter of a program is an integer, a size of a grid.\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The second and third parameters are min and max of the grid. If you want those numbers to be computed "
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"based on the data, set them both to -1 \n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The fourth parameter is an integer, the standard deviation of a Gaussian kernel expressed in a number "
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"of pixels.\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The fifth parameter of this program is a dimension of persistence that will be used in creation of "
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"the persistence heat maps.",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "If your input files contains persistence pairs of various dimension, as a fifth parameter of the "
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "procedure please provide the dimension of persistence you want to use.",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "If in your files there are only birth-death pairs of the same dimension, set the fifth parameter to "
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"-1.\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The remaining parameters are the names of files with persistence diagrams. \n",0x4c);
  if (argc < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n",0x36)
    ;
    iVar2 = 1;
  }
  else {
    iVar2 = atoi(argv[1]);
    local_2a8 = (size_t)iVar2;
    local_2b0 = atof(argv[2]);
    local_2b8 = atof(argv[3]);
    dVar6 = atof(argv[4]);
    uVar3 = atoi(argv[5]);
    local_2c4 = 0xffffffff;
    if (-1 < (int)uVar3) {
      local_2c4 = uVar3;
    }
    local_2e8 = (char **)0x0;
    iStack_2e0._M_current = (char **)0x0;
    local_2d8 = (char **)0x0;
    __args = argv + 6;
    lVar5 = (ulong)(uint)argc - 6;
    do {
      if (iStack_2e0._M_current == local_2d8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_2e8,iStack_2e0,__args);
      }
      else {
        *iStack_2e0._M_current = *__args;
        iStack_2e0._M_current = iStack_2e0._M_current + 1;
      }
      __args = __args + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    Gudhi::Persistence_representations::create_Gaussian_filter
              (&local_280,(long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6,
               1.0);
    if (iStack_2e0._M_current != local_2e8) {
      local_2c0 = aiStack_138;
      lVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"Creating a heat map based on a file : ",0x26);
        pcVar1 = local_2e8[lVar5];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::clog + -0x18) + 0x109030);
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,pcVar1,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        pcVar1 = local_2e8[lVar5];
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_268,&local_280);
        Gudhi::Persistence_representations::
        Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
        ::Persistence_heat_maps
                  (&local_250,pcVar1,&local_268,false,local_2a8,local_2b0,local_2b8,local_2c4);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_268);
        std::__cxx11::stringstream::stringstream(local_1b8);
        pcVar1 = local_2e8[lVar5];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".mps",4);
        std::__cxx11::stringbuf::str();
        Gudhi::Persistence_representations::
        Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
        ::print_to_file(&local_250,(char *)local_2a0);
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_2c0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_250.heat_map);
        if (local_250.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_250.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_250.weights.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_250.weights.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_250.interval.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_250.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_250.interval.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_250.interval.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_250.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_250.kernel.super__Function_base._M_manager)
                    ((_Any_data *)&local_250.kernel,(_Any_data *)&local_250.kernel,__destroy_functor
                    );
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != (long)iStack_2e0._M_current - (long)local_2e8 >> 3);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_280);
    if (local_2e8 != (char **)0x0) {
      operator_delete(local_2e8,(long)local_2d8 - (long)local_2e8);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates persistence heat map files (*.mps) of persistence diagrams files (*.pers) "
            << "provided as an input.The Gaussian kernels are weighted by the square of distance of a center from the "
            << "diagonal.\n"
            << "The first parameter of a program is an integer, a size of a grid.\n"
            << "The second and third parameters are min and max of the grid. If you want those numbers to be computed "
            << "based on the data, set them both to -1 \n"
            << "The fourth parameter is an integer, the standard deviation of a Gaussian kernel expressed in a number "
            << "of pixels.\n"
            << "The fifth parameter of this program is a dimension of persistence that will be used in creation of "
            << "the persistence heat maps."
            << "If your input files contains persistence pairs of various dimension, as a fifth parameter of the "
            << "procedure please provide the dimension of persistence you want to use."
            << "If in your files there are only birth-death pairs of the same dimension, set the fifth parameter to "
            << "-1.\n"
            << "The remaining parameters are the names of files with persistence diagrams. \n";

  if (argc < 7) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }

  size_t size_of_grid = (size_t)atoi(argv[1]);
  double min_ = atof(argv[2]);
  double max_ = atof(argv[3]);
  size_t stdiv = atof(argv[4]);

  unsigned dimension = std::numeric_limits<unsigned>::max();
  int dim = atoi(argv[5]);
  if (dim >= 0) {
    dimension = (unsigned)dim;
  }

  std::vector<const char*> filenames;
  for (int i = 6; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }

  std::vector<std::vector<double> > filter = Gudhi::Persistence_representations::create_Gaussian_filter(stdiv, 1);
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::clog << "Creating a heat map based on a file : " << filenames[i] << std::endl;
    Persistence_heat_maps l(filenames[i], filter, false, size_of_grid, min_, max_, dimension);

    std::stringstream ss;
    ss << filenames[i] << ".mps";
    l.print_to_file(ss.str().c_str());
  }
  return 0;
}